

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

long xmlByteConsumed(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlCharEncodingHandlerPtr pxVar2;
  uchar *puVar3;
  xmlCharEncodingOutputFunc p_Var4;
  int iVar5;
  uchar *puVar6;
  xmlParserInputBufferPtr pxVar7;
  long lVar8;
  ulong uVar9;
  int local_28 [2];
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  local_28[0] = -1;
  local_28[1] = -1;
  pxVar1 = ctxt->input;
  if (pxVar1 == (xmlParserInputPtr)0x0) {
    return -1;
  }
  pxVar7 = pxVar1->buf;
  if ((pxVar7 == (xmlParserInputBufferPtr)0x0) ||
     (pxVar2 = pxVar7->encoder, pxVar2 == (xmlCharEncodingHandlerPtr)0x0)) {
    return (long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
  }
  puVar3 = pxVar1->cur;
  if ((long)pxVar1->end - (long)puVar3 < 1) {
    uVar9 = 0;
LAB_0012d6c2:
    lVar8 = -1;
    if (uVar9 <= pxVar7->rawconsumed) {
      lVar8 = pxVar7->rawconsumed - uVar9;
    }
  }
  else {
    puVar6 = (uchar *)(*xmlMalloc)(32000);
    if (puVar6 != (uchar *)0x0) {
      local_28[1] = *(int *)&pxVar1->end - (int)puVar3;
      local_28[0] = 32000;
      p_Var4 = pxVar2->output;
      if (p_Var4 == (xmlCharEncodingOutputFunc)0x0) {
        (*xmlFree)(puVar6);
      }
      else {
        iVar5 = (*p_Var4)(puVar6,local_28,puVar3,local_28 + 1);
        (*xmlFree)(puVar6);
        if (-1 < iVar5) {
          pxVar7 = pxVar1->buf;
          uVar9 = (ulong)local_28[0];
          goto LAB_0012d6c2;
        }
      }
    }
    lVar8 = -1;
  }
  return lVar8;
}

Assistant:

long
xmlByteConsumed(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in;

    if (ctxt == NULL)
        return(-1);
    in = ctxt->input;
    if (in == NULL)
        return(-1);

    if ((in->buf != NULL) && (in->buf->encoder != NULL)) {
        int unused = 0;
	xmlCharEncodingHandler * handler = in->buf->encoder;

        /*
	 * Encoding conversion, compute the number of unused original
	 * bytes from the input not consumed and subtract that from
	 * the raw consumed value, this is not a cheap operation
	 */
        if (in->end - in->cur > 0) {
	    unsigned char *convbuf;
	    const unsigned char *cur = (const unsigned char *)in->cur;
	    int toconv, ret;

            convbuf = xmlMalloc(32000);
            if (convbuf == NULL)
                return(-1);

            toconv = in->end - cur;
            unused = 32000;
            ret = xmlEncOutputChunk(handler, convbuf, &unused, cur, &toconv);

            xmlFree(convbuf);

            if (ret != XML_ENC_ERR_SUCCESS)
                return(-1);
	}

	if (in->buf->rawconsumed < (unsigned long) unused)
	    return(-1);
	return(in->buf->rawconsumed - unused);
    }

    return(in->consumed + (in->cur - in->base));
}